

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::setHeader(QTreeView *this,QHeaderView *header)

{
  long lVar1;
  bool bVar2;
  QTreeViewPrivate *pQVar3;
  QObject *pQVar4;
  QAbstractItemModel *pQVar5;
  QItemSelectionModel *pQVar6;
  QHeaderView *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QTreeViewPrivate *d;
  undefined1 in_stack_fffffffffffffeff;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff00;
  array<QMetaObject::Connection,_5UL> *in_stack_ffffffffffffff08;
  QWidget *in_stack_ffffffffffffff18;
  QWidget *in_stack_ffffffffffffff20;
  undefined1 enable;
  QTreeView *this_00;
  offset_in_QTreeView_to_subr *in_stack_ffffffffffffff40;
  offset_in_QTreeView_to_subr *slot;
  ContextType *in_stack_ffffffffffffff48;
  code *context;
  Object *in_stack_ffffffffffffff50;
  Object *sender;
  ConnectionType in_stack_ffffffffffffff90;
  ConnectionType type;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QTreeView *)0x8eedcb);
  if ((in_RSI != pQVar3->header) && (in_RSI != (QHeaderView *)0x0)) {
    if ((pQVar3->header != (QHeaderView *)0x0) &&
       ((pQVar4 = QObject::parent((QObject *)0x8eee10), pQVar4 == in_RDI &&
        (in_stack_ffffffffffffff08 = (array<QMetaObject::Connection,_5UL> *)pQVar3->header,
        in_stack_ffffffffffffff08 != (array<QMetaObject::Connection,_5UL> *)0x0)))) {
      (**(code **)(*(long *)&(((QAbstractItemView *)in_stack_ffffffffffffff08->_M_elems)->
                             super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x20))();
    }
    pQVar3->header = in_RSI;
    QWidget::setParent(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    QHeaderView::setFirstSectionMovable
              ((QHeaderView *)in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
    pQVar5 = QAbstractItemView::model((QAbstractItemView *)in_RDI);
    if (pQVar5 == (QAbstractItemModel *)0x0) {
      (**(code **)(*(long *)&(pQVar3->header->super_QAbstractItemView).super_QAbstractScrollArea.
                             super_QFrame.super_QWidget + 0x1c8))
                (pQVar3->header,(pQVar3->super_QAbstractItemViewPrivate).model);
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8eeec1);
      if (bVar2) {
        in_stack_ffffffffffffff00 = (QAbstractItemViewPrivate *)pQVar3->header;
        pQVar6 = ::QPointer::operator_cast_to_QItemSelectionModel_
                           ((QPointer<QItemSelectionModel> *)0x8eeee9);
        (**(code **)(*(long *)&(in_stack_ffffffffffffff00->super_QAbstractScrollAreaPrivate).
                               super_QFramePrivate.super_QWidgetPrivate + 0x1d0))
                  (in_stack_ffffffffffffff00,pQVar6);
      }
    }
    QObject::connect<void(QHeaderView::*)(int,int,int),void(QTreeView::*)(int,int,int)>
              (in_stack_ffffffffffffff50,(offset_in_QHeaderView_to_subr)in_RSI,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff90);
    context = QHeaderView::sectionMoved;
    sender = (Object *)0x0;
    QObject::connect<void(QHeaderView::*)(int,int,int),void(QTreeView::*)()>
              ((Object *)0x0,(offset_in_QHeaderView_to_subr)in_RSI,
               (ContextType *)QHeaderView::sectionMoved,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff90);
    slot = (offset_in_QTreeView_to_subr *)0x0;
    QObject::connect<void(QHeaderView::*)(int,int),void(QTreeView::*)(int,int)>
              (sender,(offset_in_QHeaderView_to_subr)in_RSI,(ContextType *)context,
               (offset_in_QTreeView_to_subr *)0x0,in_stack_ffffffffffffff90);
    type = 0x8ef2e0;
    enable = 0;
    this_00 = (QTreeView *)0x0;
    QObject::connect<void(QHeaderView::*)(int),void(QTreeView::*)(int)>
              (sender,(offset_in_QHeaderView_to_subr)in_RSI,(ContextType *)context,slot,0x8ef2e0);
    QObject::connect<void(QHeaderView::*)(),void(QTreeView::*)()>
              (sender,(offset_in_QHeaderView_to_subr)in_RSI,(ContextType *)context,slot,type);
    std::array<QMetaObject::Connection,_5UL>::operator=
              ((array<QMetaObject::Connection,_5UL> *)in_RDI,in_stack_ffffffffffffff08);
    std::array<QMetaObject::Connection,_5UL>::~array((array<QMetaObject::Connection,_5UL> *)in_RDI);
    setSortingEnabled(this_00,(bool)enable);
    QAbstractItemViewPrivate::updateGeometry(in_stack_ffffffffffffff00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::setHeader(QHeaderView *header)
{
    Q_D(QTreeView);
    if (header == d->header || !header)
        return;
    if (d->header && d->header->parent() == this)
        delete d->header;
    d->header = header;
    d->header->setParent(this);
    d->header->setFirstSectionMovable(false);

    if (!d->header->model()) {
        d->header->setModel(d->model);
        if (d->selectionModel)
            d->header->setSelectionModel(d->selectionModel);
    }

    d->headerConnections = {
        connect(d->header, &QHeaderView::sectionResized,
                this, &QTreeView::columnResized),
        connect(d->header, &QHeaderView::sectionMoved,
                this, &QTreeView::columnMoved),
        connect(d->header, &QHeaderView::sectionCountChanged,
                this, &QTreeView::columnCountChanged),
        connect(d->header, &QHeaderView::sectionHandleDoubleClicked,
                this, &QTreeView::resizeColumnToContents),
        connect(d->header, &QHeaderView::geometriesChanged,
                this, &QTreeView::updateGeometries)
    };

    setSortingEnabled(d->sortingEnabled);
    d->updateGeometry();
}